

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void Dump(OutputStream *stream,SQFunctionProto *func,bool deep)

{
  byte bVar1;
  byte in_DL;
  OutputStream *in_RSI;
  OutputStream *in_RDI;
  SQObjectPtr *f;
  SQInteger si;
  SQUnsignedInteger i;
  SQUnsignedInteger n;
  undefined3 in_stack_00000034;
  SQInstruction *in_stack_00000048;
  OutputStream *in_stack_00000050;
  char *_literals;
  OutputStream *stream_00;
  SQInt32 _nlineinfos;
  SQObjectPtr *in_stack_ffffffffffffffc8;
  OutputStream *in_stack_ffffffffffffffd0;
  _func_int **local_28;
  undefined8 uVar2;
  ulong uVar3;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  uVar2 = 0;
  if (bVar1 != 0) {
    for (local_28 = (_func_int **)0x0; local_28 < in_RSI[0x18]._vptr_OutputStream;
        local_28 = (_func_int **)((long)local_28 + 1)) {
      in_stack_ffffffffffffffc8 =
           (SQObjectPtr *)(in_RSI[0x19]._vptr_OutputStream + (long)local_28 * 2);
      Dump(in_RSI,(SQFunctionProto *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
           SUB81((ulong)uVar2 >> 0x38,0));
    }
  }
  streamprintf(in_RDI,"SQInstruction sizeof %d\n",8);
  streamprintf(in_RDI,"SQObject sizeof %d\n",0x10);
  streamprintf(in_RDI,"--------------------------------------------------------------------\n");
  if (*(int *)&in_RSI[8]._vptr_OutputStream == 0x8000010) {
    _literals = (char *)(in_RSI[9]._vptr_OutputStream + 7);
  }
  else {
    _literals = "unknown";
  }
  stream_00 = in_RDI;
  streamprintf(in_RDI,"*****FUNCTION [%s]\n",_literals);
  DumpLiterals(stream_00,(SQObjectPtr *)_literals,0);
  streamprintf(in_RDI,"-----PARAMS\n");
  if (in_RSI[0xe]._vptr_OutputStream != (_func_int **)0x0) {
    streamprintf(in_RDI,"<<VARPARAMS>>\n");
  }
  uVar3 = 0;
  for (local_28 = (_func_int **)0x0; _nlineinfos = (SQInt32)((ulong)stream_00 >> 0x20),
      local_28 < in_RSI[0x16]._vptr_OutputStream; local_28 = (_func_int **)((long)local_28 + 1)) {
    streamprintf(in_RDI,"[%d] ",uVar3 & 0xffffffff);
    DumpLiteral(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    streamprintf(in_RDI,"\n");
    uVar3 = uVar3 + 1;
  }
  DumpLocals(in_RSI,(SQLocalVarInfo *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
             (SQInt32)(uVar3 >> 0x20));
  DumpLineInfo(in_stack_ffffffffffffffd0,(SQLineInfo *)in_stack_ffffffffffffffc8,_nlineinfos);
  streamprintf(in_RDI,"-----dump\n");
  DumpInstructions(in_stack_00000050,in_stack_00000048,stream._4_4_,(SQObjectPtr *)func,
                   _in_stack_00000034);
  streamprintf(in_RDI,"-----\n");
  streamprintf(in_RDI,"stack size[%d]\n",(ulong)in_RSI[0xb]._vptr_OutputStream & 0xffffffff);
  streamprintf(in_RDI,"--------------------------------------------------------------------\n\n");
  return;
}

Assistant:

void Dump(OutputStream *stream, SQFunctionProto *func, bool deep)
{

    //if (!dump_enable) return ;
    SQUnsignedInteger n = 0, i;
    SQInteger si;
    if (deep) {
        for (i = 0; i < func->_nfunctions; ++i) {
            SQObjectPtr &f = func->_functions[i];
            assert(sq_isfunction(f));
            Dump(stream, _funcproto(f), deep);
        }
    }
    streamprintf(stream, _SC("SQInstruction sizeof %d\n"), (SQInt32)sizeof(SQInstruction));
    streamprintf(stream, _SC("SQObject sizeof %d\n"), (SQInt32)sizeof(SQObject));
    streamprintf(stream, _SC("--------------------------------------------------------------------\n"));
    streamprintf(stream, _SC("*****FUNCTION [%s]\n"), sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"));
    DumpLiterals(stream, func->_literals, func->_nliterals);
    streamprintf(stream, _SC("-----PARAMS\n"));
    if (func->_varparams)
        streamprintf(stream, _SC("<<VARPARAMS>>\n"));
    n = 0;
    for (i = 0; i < func->_nparameters; i++) {
        streamprintf(stream, _SC("[%d] "), (SQInt32)n);
        DumpLiteral(stream, func->_parameters[i]);
        streamprintf(stream, _SC("\n"));
        n++;
    }
    DumpLocals(stream, func->_localvarinfos, func->_nlocalvarinfos);
    DumpLineInfo(stream, func->_lineinfos, func->_nlineinfos);
    streamprintf(stream, _SC("-----dump\n"));
    DumpInstructions(stream, func->_instructions, func->_ninstructions, func->_literals, func->_nliterals);
    streamprintf(stream, _SC("-----\n"));
    streamprintf(stream, _SC("stack size[%d]\n"), (SQInt32)func->_stacksize);
    streamprintf(stream, _SC("--------------------------------------------------------------------\n\n"));
}